

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

int gray_move_to(FT_Vector *to,gray_PWorker worker)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = to->x;
  uVar2 = to->y;
  gray_set_cell(worker,(TCoord)(uVar1 >> 6),(TCoord)(uVar2 >> 6));
  worker->x = uVar1 * 4;
  worker->y = uVar2 * 4;
  return 0;
}

Assistant:

static int
  gray_move_to( const FT_Vector*  to,
                gray_PWorker      worker )
  {
    TPos  x, y;


    /* start to a new position */
    x = UPSCALE( to->x );
    y = UPSCALE( to->y );

    gray_set_cell( RAS_VAR_ TRUNC( x ), TRUNC( y ) );

    ras.x = x;
    ras.y = y;
    return 0;
  }